

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::SWAP<std::complex<double>_>::matrix(SWAP<std::complex<double>_> *this)

{
  undefined8 *puVar1;
  SquareMatrix<std::complex<double>_> SVar2;
  
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)0x4;
  puVar1 = (undefined8 *)operator_new__(0x100);
  *(undefined8 **)(this->qubits_)._M_elems = puVar1;
  *puVar1 = 0x3ff0000000000000;
  puVar1[0xb] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[0xc] = 0x3ff0000000000000;
  puVar1[0x11] = 0;
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0x12] = 0x3ff0000000000000;
  puVar1[0x1d] = 0;
  puVar1[0x1b] = 0;
  puVar1[0x1c] = 0;
  puVar1[0x19] = 0;
  puVar1[0x1a] = 0;
  puVar1[0x17] = 0;
  puVar1[0x18] = 0;
  puVar1[0x15] = 0;
  puVar1[0x16] = 0;
  puVar1[0x13] = 0;
  puVar1[0x14] = 0;
  puVar1[0x1e] = 0x3ff0000000000000;
  puVar1[0x1f] = 0;
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )0x0;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , 1 , 0 ,
                                                  0 , 1 , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
        }